

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

ssize_t __thiscall
drace::detector::Fasttrack<std::shared_mutex>::read
          (Fasttrack<std::shared_mutex> *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  TID tid_00;
  TID TVar2;
  VC_ID VVar3;
  VC_ID VVar4;
  Fasttrack<std::shared_mutex> *extraout_RAX;
  Fasttrack<std::shared_mutex> *extraout_RAX_00;
  Fasttrack<std::shared_mutex> *extraout_RAX_01;
  undefined4 in_register_00000034;
  ThreadState *this_00;
  uint32_t tid;
  size_t id;
  size_t addr_local;
  VarState *v_local;
  ThreadState *t_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  this_00 = (ThreadState *)CONCAT44(in_register_00000034,__fd);
  VVar3 = ThreadState::return_own_id(this_00);
  VVar4 = VarState::get_read_id((VarState *)__buf);
  if (VVar3 == VVar4) {
    if ((this->log_flag & 1U) != 0) {
      (this->log_count).read_ex_same_epoch = (this->log_count).read_ex_same_epoch + 1;
    }
  }
  else {
    VVar3 = ThreadState::return_own_id(this_00);
    tid_00 = ThreadState::get_tid(this_00);
    bVar1 = VarState::is_read_shared((VarState *)__buf);
    if ((bVar1) && (VVar4 = VarState::get_vc_by_thr((VarState *)__buf,tid_00), VVar4 == VVar3)) {
      if ((this->log_flag & 1U) != 0) {
        (this->log_count).read_sh_same_epoch = (this->log_count).read_sh_same_epoch + 1;
      }
    }
    else {
      bVar1 = VarState::is_wr_race((VarState *)__buf,this_00);
      if (bVar1) {
        TVar2 = VarState::get_w_tid((VarState *)__buf);
        report_race_locked(this,TVar2,tid_00,true,false,(VarState *)__buf,__nbytes);
      }
      bVar1 = VarState::is_read_shared((VarState *)__buf);
      if (bVar1) {
        if ((this->log_flag & 1U) != 0) {
          (this->log_count).read_shared = (this->log_count).read_shared + 1;
        }
        VarState::update((VarState *)__buf,false,VVar3);
        this = extraout_RAX_01;
      }
      else {
        VVar4 = VarState::get_read_id((VarState *)__buf);
        if ((VVar4 == 0) || (TVar2 = VarState::get_r_tid((VarState *)__buf), TVar2 == tid_00)) {
          if ((this->log_flag & 1U) != 0) {
            (this->log_count).read_exclusive = (this->log_count).read_exclusive + 1;
          }
          VarState::update((VarState *)__buf,false,VVar3);
          this = extraout_RAX;
        }
        else {
          if ((this->log_flag & 1U) != 0) {
            (this->log_count).read_share = (this->log_count).read_share + 1;
          }
          VarState::set_read_shared((VarState *)__buf,VVar3);
          this = extraout_RAX_00;
        }
      }
    }
  }
  return (ssize_t)this;
}

Assistant:

void read(ThreadState* t, VarState* v, size_t addr) {
    if (t->return_own_id() ==
        v->get_read_id()) {  // read same epoch, same thread;
      if (log_flag) {
        log_count.read_ex_same_epoch++;
      }
      return;
    }

    size_t id = t->return_own_id();
    uint32_t tid = t->get_tid();

    if (v->is_read_shared() &&
        v->get_vc_by_thr(tid) == id) {  // read shared same epoch
      if (log_flag) {
        log_count.read_sh_same_epoch++;
      }
      return;
    }

    if (v->is_wr_race(t)) {  // write-read race
      report_race_locked(v->get_w_tid(), tid, true, false, *v, addr);
    }

    // update vc
    if (!v->is_read_shared()) {
      if (v->get_read_id() == VarState::VAR_NOT_INIT ||
          (v->get_r_tid() ==
           tid))  // read exclusive->read of same thread but newer epoch
      {
        if (log_flag) {
          log_count.read_exclusive++;
        }
        v->update(false, id);
      } else {  // read gets shared
        if (log_flag) {
          log_count.read_share++;
        }
        v->set_read_shared(id);
      }
    } else {  // read shared
      if (log_flag) {
        log_count.read_shared++;
      }
      v->update(false, id);
    }
  }